

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

bool __thiscall slang::SourceManager::isMacroLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  
  bVar3 = false;
  if ((((ulong)location & 0xfffffff) != 0) &&
     (bVar3 = false, (location._0_4_ & 0xfffffff) != 0xfffffff)) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    uVar4 = (ulong)(location._0_4_ & 0xfffffff);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(this->bufferEntries).
                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            0x6db6db6db6db6db7;
    if (uVar2 < uVar4 || uVar2 - uVar4 == 0) {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0x95,"bool slang::SourceManager::isMacroLoc(SourceLocation) const");
    }
    bVar3 = pvVar1 != (pointer)0x0 &&
            *(__index_type *)
             ((long)&pvVar1[uVar4].
                     super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                     .
                     super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                     .
                     super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
             + 0x30) == '\x01';
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return bVar3;
}

Assistant:

bool SourceManager::isMacroLoc(SourceLocation location) const {
    if (location.buffer() == SourceLocation::NoLocation.buffer())
        return false;

    auto buffer = location.buffer();
    if (!buffer)
        return false;

    std::shared_lock lock(mut);

    ASSERT(buffer.getId() < bufferEntries.size());
    return std::get_if<ExpansionInfo>(&bufferEntries[buffer.getId()]) != nullptr;
}